

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping>::copyAppend
          (QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping> *this,
          SeparateToCombinedImageSamplerMapping *b,SeparateToCombinedImageSamplerMapping *e)

{
  qsizetype *pqVar1;
  SeparateToCombinedImageSamplerMapping *pSVar2;
  long lVar3;
  Data *pDVar4;
  int iVar5;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size;
      pDVar4 = (b->combinedSamplerName).d.d;
      pSVar2[lVar3].combinedSamplerName.d.d = pDVar4;
      pSVar2[lVar3].combinedSamplerName.d.ptr = (b->combinedSamplerName).d.ptr;
      pSVar2[lVar3].combinedSamplerName.d.size = (b->combinedSamplerName).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      iVar5 = b->samplerBinding;
      pSVar2[lVar3].textureBinding = b->textureBinding;
      pSVar2[lVar3].samplerBinding = iVar5;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size
      ;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }